

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O2

object_task<lzham::lzcompressor> * __thiscall
lzham::
lzham_new<lzham::object_task<lzham::lzcompressor>,void*,lzham::lzcompressor*,void(lzham::lzcompressor::*)(unsigned_long_long,void*),lzham::object_task_flags>
          (lzham *this,lzham_malloc_context context,void **init0,lzcompressor **init1,
          offset_in_lzcompressor_to_subr *init2,object_task_flags *init3)

{
  lzham_malloc_context pvVar1;
  lzcompressor *plVar2;
  lzcompressor *plVar3;
  lzcompressor *plVar4;
  offset_in_lzcompressor_to_subr oVar5;
  object_task<lzham::lzcompressor> *poVar6;
  
  poVar6 = (object_task<lzham::lzcompressor> *)
           lzham::lzham_malloc(this,(void *)0x30,0,(ulong *)init1);
  if (poVar6 != (object_task<lzham::lzcompressor> *)0x0) {
    pvVar1 = *context;
    plVar2 = (lzcompressor *)*init0;
    oVar5 = *init2;
    plVar3 = *init1;
    plVar4 = init1[1];
    (poVar6->super_executable_task)._vptr_executable_task = (_func_int **)&PTR_execute_task_00115ce8
    ;
    poVar6->m_malloc_context = pvVar1;
    poVar6->m_pObject = plVar2;
    poVar6->m_pMethod = (object_method_ptr)plVar3;
    *(lzcompressor **)&poVar6->field_0x20 = plVar4;
    poVar6->m_flags = (uint)oVar5;
  }
  return poVar6;
}

Assistant:

inline T* lzham_new(lzham_malloc_context context, const A& init0, const B& init1, const C& init2, const D& init3)
   {
      T* p = static_cast<T*>(lzham_malloc(context, sizeof(T)));
      if (!p) return NULL;
      return new (static_cast<void*>(p)) T(init0, init1, init2, init3); 
   }